

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O0

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,true>
::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,true>
           *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *dst)

{
  int iVar1;
  Index IVar2;
  Index index;
  Index IVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *pPVar8;
  Scalar *pSVar9;
  byte local_1a9;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_1,_false> local_170;
  Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_1,_false>
  local_130;
  int local_ec;
  undefined1 local_e8 [4];
  int i;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_1,_false> local_a8;
  long local_68;
  Index k;
  Index kPrev;
  Index k0;
  Index r;
  Scalar local_31;
  undefined1 local_30 [8];
  Matrix<bool,__1,_1,_0,__1,_1> mask;
  Index n;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *dst_local;
  permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_true>
  *this_local;
  
  mask.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       permut_matrix_product_retval<Eigen::PermutationMatrix<-1,_-1,_int>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1,_true>
       ::rows((permut_matrix_product_retval<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_true>
               *)this);
  pSVar4 = extract_data<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>(dst);
  pSVar5 = extract_data<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                     ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)(this + 8));
  if (pSVar4 == pSVar5) {
    IVar3 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                      (*(PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> **)this);
    Matrix<bool,_-1,_1,_0,_-1,_1>::Matrix((Matrix<bool,__1,_1,_0,__1,_1> *)local_30,(long)IVar3);
    local_31 = false;
    DenseBase<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>_>::fill
              ((DenseBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_> *)local_30,&local_31);
    k0 = 0;
    while (IVar2 = k0,
          IVar3 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                            (*(PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> **)this),
          IVar2 < IVar3) {
      while( true ) {
        IVar2 = k0;
        IVar3 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                          (*(PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> **)this);
        local_1a9 = 0;
        if (IVar2 < IVar3) {
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>,_1> *)local_30,
                              k0);
          local_1a9 = *pSVar6;
        }
        IVar2 = k0;
        if ((local_1a9 & 1) == 0) break;
        k0 = k0 + 1;
      }
      IVar3 = PermutationBase<Eigen::PermutationMatrix<-1,_-1,_int>_>::size
                        (*(PermutationBase<Eigen::PermutationMatrix<_1,__1,_int>_> **)this);
      index = k0;
      if (IVar3 <= IVar2) break;
      kPrev = k0;
      k = k0;
      k0 = k0 + 1;
      pSVar7 = PlainObjectBase<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>_>::coeffRef
                         ((PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_> *)local_30,index);
      *pSVar7 = true;
      pPVar8 = &PermutationMatrix<-1,_-1,_int>::indices(*(PermutationMatrix<_1,__1,_int> **)this)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
      pSVar9 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff(pPVar8,kPrev);
      iVar1 = *pSVar9;
      while (local_68 = (long)iVar1, local_68 != kPrev) {
        Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1,_1,_false>::
        Block(&local_a8,dst,local_68);
        Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1,_1,_false>::
        Block((Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_1,_false>
               *)local_e8,dst,k);
        DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,1,false>>
        ::swap<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,1,false>>
                  ((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,1,false>>
                    *)&local_a8,
                   (DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_1,_false>_>
                    *)local_e8,0);
        pSVar7 = PlainObjectBase<Eigen::Matrix<bool,_-1,_1,_0,_-1,_1>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_> *)local_30,
                            local_68);
        *pSVar7 = true;
        k = local_68;
        pPVar8 = &PermutationMatrix<-1,_-1,_int>::indices(*(PermutationMatrix<_1,__1,_int> **)this)
                  ->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
        pSVar9 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff(pPVar8,local_68);
        iVar1 = *pSVar9;
      }
    }
    Matrix<bool,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<bool,__1,_1,_0,__1,_1> *)local_30);
  }
  else {
    for (local_ec = 0;
        local_ec <
        mask.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        local_ec = local_ec + 1) {
      pPVar8 = &PermutationMatrix<-1,_-1,_int>::indices(*(PermutationMatrix<_1,__1,_int> **)this)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>;
      pSVar9 = PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::coeff(pPVar8,(long)local_ec);
      Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1,_1,_false>
      ::Block(&local_130,(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)(this + 8),
              (long)*pSVar9);
      Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_1,_1,_false>::Block
                (&local_170,dst,(long)local_ec);
      Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,1,1,false>::operator=
                ((Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,1,1,false> *)
                 &local_170,
                 (DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1,_1,_false>_>
                  *)&local_130);
    }
  }
  return;
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && extract_data(dst) == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }